

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

result __thiscall
fmt::v7::detail::fixed_handler::on_digit
          (fixed_handler *this,char digit,uint64_t divisor,uint64_t remainder,uint64_t error,
          int param_5,bool integral)

{
  bool bVar1;
  round_direction rVar2;
  int iVar3;
  int local_48;
  int i;
  round_direction dir;
  bool integral_local;
  int param_5_local;
  uint64_t error_local;
  uint64_t remainder_local;
  uint64_t divisor_local;
  char digit_local;
  fixed_handler *this_local;
  
  if (divisor <= remainder) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/include/fmt/format-inl.h"
                ,0x64f,"");
  }
  iVar3 = this->size;
  this->size = iVar3 + 1;
  this->buf[iVar3] = digit;
  if ((integral) || (error < remainder)) {
    if (this->size < this->precision) {
      this_local._4_4_ = more;
    }
    else {
      if (integral) {
        if ((error != 1) || (divisor < 3)) {
          assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/include/fmt/format-inl.h"
                      ,0x659,"");
        }
      }
      else if ((divisor <= error) || (divisor - error <= error)) {
        return error;
      }
      rVar2 = get_round_direction(divisor,remainder,error);
      if (rVar2 == up) {
        iVar3 = this->size + -1;
        this->buf[iVar3] = this->buf[iVar3] + '\x01';
        iVar3 = this->size;
        while( true ) {
          local_48 = iVar3 + -1;
          bVar1 = false;
          if (0 < local_48) {
            bVar1 = '9' < this->buf[local_48];
          }
          if (!bVar1) break;
          this->buf[local_48] = '0';
          this->buf[iVar3 + -2] = this->buf[iVar3 + -2] + '\x01';
          iVar3 = local_48;
        }
        if ('9' < *this->buf) {
          *this->buf = '1';
          if ((this->fixed & 1U) == 0) {
            this->exp10 = this->exp10 + 1;
          }
          else {
            iVar3 = this->size;
            this->size = iVar3 + 1;
            this->buf[iVar3] = '0';
          }
        }
        this_local._4_4_ = done;
      }
      else {
        this_local._4_4_ = error;
        if (rVar2 == down) {
          this_local._4_4_ = done;
        }
      }
    }
  }
  else {
    this_local._4_4_ = error;
  }
  return this_local._4_4_;
}

Assistant:

digits::result on_digit(char digit, uint64_t divisor, uint64_t remainder,
                          uint64_t error, int, bool integral) {
    FMT_ASSERT(remainder < divisor, "");
    buf[size++] = digit;
    if (!integral && error >= remainder) return digits::error;
    if (size < precision) return digits::more;
    if (!integral) {
      // Check if error * 2 < divisor with overflow prevention.
      // The check is not needed for the integral part because error = 1
      // and divisor > (1 << 32) there.
      if (error >= divisor || error >= divisor - error) return digits::error;
    } else {
      FMT_ASSERT(error == 1 && divisor > 2, "");
    }
    auto dir = get_round_direction(divisor, remainder, error);
    if (dir != round_direction::up)
      return dir == round_direction::down ? digits::done : digits::error;
    ++buf[size - 1];
    for (int i = size - 1; i > 0 && buf[i] > '9'; --i) {
      buf[i] = '0';
      ++buf[i - 1];
    }
    if (buf[0] > '9') {
      buf[0] = '1';
      if (fixed)
        buf[size++] = '0';
      else
        ++exp10;
    }
    return digits::done;
  }